

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

char * assignGapColorForO(float gap,int class)

{
  char *local_18;
  char *colorValue;
  int class_local;
  float gap_local;
  
  if (class == 6) {
    local_18 = "pale_green ";
  }
  else if (gap <= 0.35) {
    if (gap <= 0.25) {
      if (gap <= 0.15) {
        if (gap <= 0.0) {
          if (gap <= -0.1) {
            if (gap <= -0.2) {
              if (gap <= -0.3) {
                if (gap <= -0.4) {
                  local_18 = "orange_red ";
                }
                else {
                  local_18 = "red ";
                }
              }
              else {
                local_18 = "orange ";
              }
            }
            else {
              local_18 = "yellow ";
            }
          }
          else {
            local_18 = "yellow_green ";
          }
        }
        else {
          local_18 = "green ";
        }
      }
      else {
        local_18 = "aquamarine ";
      }
    }
    else {
      local_18 = "sky_blue ";
    }
  }
  else {
    local_18 = "cornflower_blue ";
  }
  return local_18;
}

Assistant:

char* assignGapColorForO(float gap, int class)
{
   char *colorValue = "";
   //if (class == 4)     { colorValue = "pale_green ";      } /* hbond *//* 04/16/2015 SJ changed 4 to 6, as H-bond are now 6 in NODEWIDTH, see probe.h*/
   if (class == 6)     { colorValue = "pale_green ";      }
   else if (gap > 0.35){ colorValue = "cornflower_blue "; }
   else if (gap > 0.25){ colorValue = "sky_blue ";        }
   else if (gap > 0.15){ colorValue = "aquamarine ";      }
   else if (gap > 0.0) { colorValue = "green ";           }
   else if (gap >-0.1) { colorValue = "yellow_green ";    }
   else if (gap >-0.2) { colorValue = "yellow ";          }
   else if (gap >-0.3) { colorValue = "orange ";          }
   else if (gap >-0.4) { colorValue = "red ";             }
   else                { colorValue = "orange_red ";      }
   return colorValue;
}